

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# privparent.c
# Opt level: O1

void privop_pasv_accept(session_t *sess)

{
  int fd;
  
  fd = accept_timeout(sess->pasv_listen_fd,(sockaddr_in *)0x0,tunable_accept_timeout);
  close(sess->pasv_listen_fd);
  sess->pasv_listen_fd = -1;
  if (fd != -1) {
    priv_sock_send_result(sess->parent_fd,'\x01');
    priv_sock_send_fd(sess->parent_fd,fd);
    close(fd);
    return;
  }
  priv_sock_send_result(sess->parent_fd,'\x02');
  return;
}

Assistant:

void privop_pasv_accept(session_t *sess) {
  int fd = accept_timeout(sess->pasv_listen_fd, NULL, tunable_accept_timeout);
  close(sess->pasv_listen_fd);
  sess->pasv_listen_fd = -1;
  if (fd == -1) {
    priv_sock_send_result(sess->parent_fd, PRIV_SOCK_RESULT_BAD);
  } else {
    priv_sock_send_result(sess->parent_fd, PRIV_SOCK_RESULT_OK);
    priv_sock_send_fd(sess->parent_fd, fd);
    close(fd);
  }
}